

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::net::Socket_testFailConnect_Test::TestBody(Socket_testFailConnect_Test *this)

{
  char cVar1;
  socklen_t in_ECX;
  sockaddr *__addr;
  allocator local_c9;
  string local_c8;
  Socket socket;
  IPAddress local_98;
  
  Socket::Socket(&socket);
  Socket::open(&socket,(char *)0x2,1);
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 != '\0') {
    std::__cxx11::string::string((string *)&local_c8,"127.0.0.1",&local_c9);
    IPAddress::v4(&local_98,&local_c8,0x3039);
    Socket::connect(&socket,(int)&local_98,__addr,in_ECX);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  testing::Message::Message((Message *)&local_98);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_c8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/SocketTest.cpp"
             ,0x30,
             "Expected: socket.connect(IPAddress::v4(\"127.0.0.1\", 12345)) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_98);
  Socket::~Socket(&socket);
  return;
}

Assistant:

TEST(Socket, testFailConnect)
{
    Socket socket;
    socket.open(AF_INET, SOCK_STREAM);
    ASSERT_THROW(socket.connect(IPAddress::v4("127.0.0.1", 12345)),
                 std::runtime_error);
}